

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

box3f * __thiscall pbrt::Object::getBounds(Object *this)

{
  undefined8 uVar1;
  bool bVar2;
  element_type *peVar3;
  iterator this_00;
  box3f *b;
  element_type *peVar4;
  long in_RSI;
  box3f *in_RDI;
  box3f gb;
  shared_ptr<pbrt::Shape> *geom;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_> *__range1_1;
  box3f ib;
  shared_ptr<pbrt::Instance> *inst;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
  *__range1;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff28;
  undefined6 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff36;
  undefined1 in_stack_ffffffffffffff37;
  box3f local_b0;
  box3f *in_stack_ffffffffffffff68;
  box3f *in_stack_ffffffffffffff70;
  __normal_iterator<std::shared_ptr<pbrt::Shape>_*,_std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>_>
  local_88;
  long local_80;
  box3f local_78;
  __shared_ptr *local_60;
  shared_ptr<pbrt::Instance> *local_58;
  __normal_iterator<std::shared_ptr<pbrt::Instance>_*,_std::vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>_>
  local_50;
  long local_48;
  undefined8 local_2c;
  undefined8 local_24;
  undefined8 local_1c;
  undefined4 local_14;
  
  if ((*(byte *)(in_RSI + 0xa8) & 1) == 0) {
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)
               CONCAT17(in_stack_ffffffffffffff37,
                        CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)),
               in_stack_ffffffffffffff28);
    if ((*(byte *)(in_RSI + 0xa8) & 1) == 0) {
      math::box3f::empty_box();
      *(undefined8 *)(in_RSI + 0xac) = local_2c;
      *(undefined8 *)(in_RSI + 0xb4) = local_24;
      *(undefined8 *)(in_RSI + 0xbc) = local_1c;
      local_48 = in_RSI + 0x48;
      local_50._M_current =
           (shared_ptr<pbrt::Instance> *)
           std::
           vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
           ::begin((vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
                    *)in_stack_ffffffffffffff28);
      local_58 = (shared_ptr<pbrt::Instance> *)
                 std::
                 vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
                 ::end((vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
                        *)in_stack_ffffffffffffff28);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::shared_ptr<pbrt::Instance>_*,_std::vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>_>
                                 *)CONCAT17(in_stack_ffffffffffffff37,
                                            CONCAT16(in_stack_ffffffffffffff36,
                                                     in_stack_ffffffffffffff30)),
                                (__normal_iterator<std::shared_ptr<pbrt::Instance>_*,_std::vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>_>
                                 *)in_stack_ffffffffffffff28), bVar2) {
        local_60 = (__shared_ptr *)
                   __gnu_cxx::
                   __normal_iterator<std::shared_ptr<pbrt::Instance>_*,_std::vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>_>
                   ::operator*(&local_50);
        bVar2 = std::__shared_ptr::operator_cast_to_bool(local_60);
        if (bVar2) {
          peVar3 = std::
                   __shared_ptr_access<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1b5300);
          (*(peVar3->super_Entity)._vptr_Entity[3])(&local_78);
          in_stack_ffffffffffffff37 = math::box3f::empty(&local_78);
          if (!(bool)in_stack_ffffffffffffff37) {
            math::box3f::extend(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
          }
        }
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<pbrt::Instance>_*,_std::vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>_>
        ::operator++(&local_50);
      }
      local_80 = in_RSI + 0x18;
      local_88._M_current =
           (shared_ptr<pbrt::Shape> *)
           std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
           ::begin((vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
                    *)in_stack_ffffffffffffff28);
      this_00 = std::
                vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
                ::end((vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
                       *)in_stack_ffffffffffffff28);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::shared_ptr<pbrt::Shape>_*,_std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>_>
                                 *)CONCAT17(in_stack_ffffffffffffff37,
                                            CONCAT16(in_stack_ffffffffffffff36,
                                                     in_stack_ffffffffffffff30)),
                                (__normal_iterator<std::shared_ptr<pbrt::Shape>_*,_std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>_>
                                 *)in_stack_ffffffffffffff28), bVar2) {
        b = (box3f *)__gnu_cxx::
                     __normal_iterator<std::shared_ptr<pbrt::Shape>_*,_std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>_>
                     ::operator*(&local_88);
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)b);
        if (bVar2) {
          peVar4 = std::__shared_ptr_access<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1b53f0);
          (*(peVar4->super_Entity)._vptr_Entity[6])(&local_b0);
          in_stack_ffffffffffffff36 = math::box3f::empty(&local_b0);
          if (!(bool)in_stack_ffffffffffffff36) {
            math::box3f::extend((box3f *)this_00._M_current,b);
          }
        }
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<pbrt::Shape>_*,_std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>_>
        ::operator++(&local_88);
      }
      *(undefined1 *)(in_RSI + 0xa8) = 1;
      uVar1 = *(undefined8 *)(in_RSI + 0xac);
      (in_RDI->lower).x = (float)(int)uVar1;
      (in_RDI->lower).y = (float)(int)((ulong)uVar1 >> 0x20);
      *(undefined8 *)&(in_RDI->lower).z = *(undefined8 *)(in_RSI + 0xb4);
      uVar1 = *(undefined8 *)(in_RSI + 0xbc);
      (in_RDI->upper).y = (float)(int)uVar1;
      (in_RDI->upper).z = (float)(int)((ulong)uVar1 >> 0x20);
    }
    else {
      uVar1 = *(undefined8 *)(in_RSI + 0xac);
      (in_RDI->lower).x = (float)(int)uVar1;
      (in_RDI->lower).y = (float)(int)((ulong)uVar1 >> 0x20);
      *(undefined8 *)&(in_RDI->lower).z = *(undefined8 *)(in_RSI + 0xb4);
      uVar1 = *(undefined8 *)(in_RSI + 0xbc);
      (in_RDI->upper).y = (float)(int)uVar1;
      (in_RDI->upper).z = (float)(int)((ulong)uVar1 >> 0x20);
    }
    local_14 = 1;
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1b5493);
  }
  else {
    uVar1 = *(undefined8 *)(in_RSI + 0xac);
    (in_RDI->lower).x = (float)(int)uVar1;
    (in_RDI->lower).y = (float)(int)((ulong)uVar1 >> 0x20);
    *(undefined8 *)&(in_RDI->lower).z = *(undefined8 *)(in_RSI + 0xb4);
    uVar1 = *(undefined8 *)(in_RSI + 0xbc);
    (in_RDI->upper).y = (float)(int)uVar1;
    (in_RDI->upper).z = (float)(int)((ulong)uVar1 >> 0x20);
  }
  return in_RDI;
}

Assistant:

box3f Object::getBounds() 
  {
    if (haveComputedBounds) return bounds;

    std::lock_guard<std::mutex> lock(mutex);
    if (haveComputedBounds) return bounds;
    
    bounds = box3f::empty_box();
    for (auto &inst : instances) {
      if (inst) {
        const box3f ib = inst->getBounds();
        if (!ib.empty())
          bounds.extend(ib);
      }
    }
    for (auto &geom : shapes) {
      if (geom) {
        const box3f gb = geom->getBounds();
        if (!gb.empty())
          bounds.extend(gb);
      }
    }
    haveComputedBounds = true;
    return bounds;
  }